

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::BinaryAggregateHeap<long,_double,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<long,_double,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          long *key,double *value)

{
  long lVar1;
  idx_t iVar2;
  HeapEntry<long> HVar3;
  ulong __holeIndex;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *__first;
  HeapEntry<double> HVar4;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> __value;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = *key;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    HVar3.value = __first[__holeIndex].first.value;
    HVar4.value = __first[__holeIndex].second.value;
  }
  else {
    lVar1 = (__first->first).value;
    if (*key <= lVar1) {
      return;
    }
    if (1 < (long)__holeIndex) {
      HVar3.value = __first[__holeIndex - 1].first.value;
      HVar4.value = __first[__holeIndex - 1].second.value;
      __first[__holeIndex - 1].first.value = lVar1;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      __value.second.value = HVar4.value;
      __value.first.value = HVar3.value;
      ::std::
      __adjust_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>>
                (__first,0,(long)(__holeIndex * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_>_&)>
                  )Compare);
    }
    __first = this->heap;
    iVar2 = this->size;
    __first[iVar2 - 1].first.value = *key;
    __first[iVar2 - 1].second.value = *value;
    HVar3.value = __first[iVar2 - 1].first.value;
    HVar4.value = __first[iVar2 - 1].second.value;
    __holeIndex = ((long)(iVar2 * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00.second.value = HVar4.value;
  __value_00.first.value = HVar3.value;
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>>
            (__first,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}